

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

void ZSTD_insertDUBT1(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,U32 current,
                     BYTE *inputEnd,U32 nbCompares,U32 btLow,int extDict)

{
  BYTE *iStart;
  uint *match_00;
  size_t sVar1;
  BYTE *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int in_stack_00000008;
  BYTE *mBase;
  size_t matchLength;
  U32 *nextPtr;
  U32 windowLow;
  U32 dummy32;
  U32 matchIndex;
  U32 *largerPtr;
  U32 *smallerPtr;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  BYTE *iend;
  BYTE *ip;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  BYTE *local_e8;
  BYTE *local_e0;
  BYTE *local_d0;
  BYTE *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  uint uVar2;
  uint local_a0;
  uint local_9c;
  uint *local_98;
  uint *local_90;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  BYTE *local_68;
  uint local_5c;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *local_40;
  uint local_38;
  int local_34;
  long local_30;
  uint local_28;
  int local_24;
  uint local_14;
  
  local_30 = *(long *)(in_RDI + 0x40);
  local_34 = *(int *)(in_RSI + 4) + -1;
  local_38 = (1 << ((byte)local_34 & 0x1f)) - 1;
  local_40 = (BYTE *)0x0;
  local_48 = (BYTE *)0x0;
  local_50 = *(BYTE **)(in_RDI + 8);
  local_58 = *(BYTE **)(in_RDI + 0x10);
  local_5c = *(uint *)(in_RDI + 0x18);
  if (in_EDX < local_5c) {
    iStart = local_58 + in_EDX;
    local_d0 = local_58 + local_5c;
  }
  else {
    iStart = local_50 + in_EDX;
    local_d0 = in_RCX;
  }
  local_70 = local_d0;
  local_78 = local_58 + local_5c;
  local_80 = local_50 + local_5c;
  local_90 = (uint *)(local_30 + (ulong)((in_EDX & local_38) << 1) * 4);
  local_9c = *local_90;
  uVar2 = *(uint *)(in_RDI + 0x1c);
  local_98 = local_90 + 1;
  local_68 = iStart;
  local_28 = in_R9D;
  local_24 = in_R8D;
  local_14 = in_EDX;
LAB_0021ceb9:
  do {
    if (local_24 == 0 || local_9c <= uVar2) {
LAB_0021d149:
      *local_98 = 0;
      *local_90 = 0;
      return;
    }
    match_00 = (uint *)(local_30 + (ulong)((local_9c & local_38) << 1) * 4);
    if (local_40 < local_48) {
      local_e0 = local_40;
    }
    else {
      local_e0 = local_48;
    }
    if (((in_stack_00000008 == 0) || ((BYTE *)(ulong)local_5c <= local_e0 + local_9c)) ||
       (local_14 < local_5c)) {
      if ((in_stack_00000008 == 0) || ((BYTE *)(ulong)local_5c <= local_e0 + local_9c)) {
        local_e8 = local_50;
      }
      else {
        local_e8 = local_58;
      }
      local_88 = local_e8 + local_9c;
      local_24 = local_24 + -1;
      sVar1 = ZSTD_count((BYTE *)CONCAT44(uVar2,in_stack_ffffffffffffff58),(BYTE *)match_00,local_e0
                        );
      local_e0 = local_e0 + sVar1;
      in_stack_ffffffffffffff40 = local_e8;
    }
    else {
      local_88 = local_58 + local_9c;
      local_24 = local_24 + -1;
      sVar1 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(uVar2,in_stack_ffffffffffffff58),(BYTE *)match_00,local_e0
                         ,in_stack_ffffffffffffff40,iStart);
      local_e0 = local_e0 + sVar1;
      if ((BYTE *)(ulong)local_5c <= local_e0 + local_9c) {
        local_88 = local_50 + local_9c;
      }
    }
    if (local_68 + (long)local_e0 == local_70) goto LAB_0021d149;
    if (local_68[(long)local_e0] <= local_88[(long)local_e0]) {
      *local_98 = local_9c;
      if (local_9c <= local_28) {
        local_98 = &local_a0;
        goto LAB_0021d149;
      }
      local_9c = *match_00;
      local_98 = match_00;
      local_48 = local_e0;
      goto LAB_0021ceb9;
    }
    *local_90 = local_9c;
    if (local_9c <= local_28) {
      local_90 = &local_a0;
      goto LAB_0021d149;
    }
    local_90 = match_00 + 1;
    local_9c = match_00[1];
    local_40 = local_e0;
  } while( true );
}

Assistant:

static void ZSTD_insertDUBT1(
                 ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                 U32 current, const BYTE* inputEnd,
                 U32 nbCompares, U32 btLow, int extDict)
{
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const ip = (current>=dictLimit) ? base + current : dictBase + current;
    const BYTE* const iend = (current>=dictLimit) ? inputEnd : dictBase + dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 matchIndex = *smallerPtr;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;

    DEBUGLOG(8, "ZSTD_insertDUBT1(%u) (dictLimit=%u, lowLimit=%u)",
                current, dictLimit, windowLow);
    assert(current >= btLow);
    assert(ip < iend);   /* condition for ZSTD_count */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

        if ( (!extDict)
          || (matchIndex+matchLength >= dictLimit)  /* both in current segment*/
          || (current < dictLimit) /* both in extDict */) {
            const BYTE* const mBase = !extDict || ((matchIndex+matchLength) >= dictLimit) ? base : dictBase;
            assert( (matchIndex+matchLength >= dictLimit)   /* might be wrong if extDict is incorrectly set to 0 */
                 || (current < dictLimit) );
            match = mBase + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        DEBUGLOG(8, "ZSTD_insertDUBT1: comparing %u with %u : found %u common bytes ",
                    current, matchIndex, (U32)matchLength);

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is smaller : next => %u",
                        matchIndex, btLow, nextPtr[1]);
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            DEBUGLOG(8, "ZSTD_insertDUBT1: %u (>btLow=%u) is larger => %u",
                        matchIndex, btLow, nextPtr[0]);
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
}